

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::convert_triangles_to_quads
          (SceneGraph *this,Ref<embree::SceneGraph::TriangleMeshNode> *tmesh)

{
  undefined8 uVar1;
  uint a0;
  value_type *pvVar2;
  pointer pTVar3;
  Node *pNVar4;
  uint uVar5;
  uint uVar6;
  QuadMeshNode *pQVar7;
  TriangleMeshNode *pTVar8;
  long lVar9;
  ulong uVar10;
  pair<int,_int> pVar11;
  uint uVar12;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  value_type *__x;
  ulong uVar13;
  Quad local_78;
  vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  *local_68;
  Ref<embree::SceneGraph::MaterialNode> local_60;
  QuadMeshNode *local_58;
  Node *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar14;
  
  pQVar7 = (QuadMeshNode *)::operator_new(0xd8);
  pTVar8 = tmesh->ptr;
  local_60.ptr = (pTVar8->material).ptr;
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
    pTVar8 = tmesh->ptr;
  }
  QuadMeshNode::QuadMeshNode(pQVar7,&local_60,pTVar8->time_range,0);
  (*(pQVar7->super_Node).super_RefCount._vptr_RefCount[2])(pQVar7);
  if (local_60.ptr != (MaterialNode *)0x0) {
    (*((local_60.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pvVar2 = (tmesh->ptr->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = pQVar7;
  for (__x = (tmesh->ptr->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::push_back(&pQVar7->positions,__x);
  }
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::operator=(&pQVar7->normals,&tmesh->ptr->normals);
  std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
            (&pQVar7->texcoords,&tmesh->ptr->texcoords);
  local_68 = &pQVar7->quads;
  uVar13 = 0;
  local_50 = (Node *)this;
  while( true ) {
    pNVar4 = local_50;
    pQVar7 = local_58;
    pTVar3 = (tmesh->ptr->triangles).
             super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = (long)(tmesh->ptr->triangles).
                  super__Vector_base<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3;
    uVar10 = lVar9 / 0xc;
    if (uVar10 <= uVar13) break;
    a0 = pTVar3[uVar13].v0;
    uVar1._0_4_ = pTVar3[uVar13].v1;
    uVar1._4_4_ = pTVar3[uVar13].v2;
    uVar14 = uVar13 + 1;
    if (uVar14 == uVar10) {
      local_78.v0 = a0;
      local_78.v1 = (undefined4)uVar1;
      local_78.v2 = uVar1._4_4_;
      local_78.v3 = uVar1._4_4_;
      std::
      vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
      ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
      uVar14 = uVar13;
      uVar5 = local_78.v1;
      uVar6 = local_78.v2;
    }
    else {
      uStack_40 = 0;
      local_48 = uVar1;
      pVar11 = quad_index3(a0,(undefined4)uVar1,uVar1._4_4_,pTVar3[uVar14].v0,pTVar3[uVar14].v1,
                           pTVar3[uVar14].v2);
      uVar6 = local_78.v2;
      uVar5 = local_78.v1;
      local_78.v1 = (uint)local_48;
      local_78.v2 = (uint)((ulong)local_48 >> 0x20);
      if ((ulong)pVar11 >> 0x20 == 0xffffffff) {
        local_78.v0 = a0;
        local_78.v3 = uVar1._4_4_;
        std::
        vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
        ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
        uVar14 = uVar13;
        uVar5 = local_78.v1;
        uVar6 = local_78.v2;
      }
      else {
        uVar12 = pVar11.second;
        switch(pVar11.first) {
        case 0:
          local_78.v0 = uVar12;
          local_78.v3 = a0;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
          uVar5 = local_78.v1;
          uVar6 = local_78.v2;
          break;
        case 1:
          local_78.v0 = a0;
          local_78.v1 = (undefined4)uVar1;
          local_78.v2 = uVar12;
          local_78.v3 = uVar1._4_4_;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
          uVar5 = local_78.v1;
          uVar6 = local_78.v2;
          break;
        case 2:
          local_78.v0 = local_78.v1;
          local_78.v1 = local_78.v2;
          local_78.v2 = uVar12;
          local_78.v3 = a0;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
          uVar5 = local_78.v1;
          uVar6 = local_78.v2;
          break;
        case -1:
          local_78.v0 = local_78.v1;
          local_78.v1 = local_78.v2;
          local_78.v2 = uVar12;
          local_78.v3 = a0;
          std::
          vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
          ::emplace_back<embree::SceneGraph::QuadMeshNode::Quad>(local_68,&local_78);
          uVar5 = local_78.v1;
          uVar6 = local_78.v2;
        }
      }
    }
    local_78.v2 = uVar6;
    local_78.v1 = uVar5;
    uVar13 = uVar14 + 1;
  }
  (local_50->super_RefCount)._vptr_RefCount = (_func_int **)local_58;
  (*(local_58->super_Node).super_RefCount._vptr_RefCount[2])(local_58,pTVar3,lVar9 % 0xc);
  (*(pQVar7->super_Node).super_RefCount._vptr_RefCount[3])(pQVar7);
  return (Ref<embree::SceneGraph::Node>)pNVar4;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_triangles_to_quads ( Ref<SceneGraph::TriangleMeshNode> tmesh )
  {
    Ref<SceneGraph::QuadMeshNode> qmesh = new SceneGraph::QuadMeshNode(tmesh->material,tmesh->time_range,0);

    for (auto& p : tmesh->positions)
      qmesh->positions.push_back(p);
    
    qmesh->normals = tmesh->normals;
    qmesh->texcoords = tmesh->texcoords;
    
    for (size_t i=0; i<tmesh->triangles.size(); i++)
    {
      const int a0 = tmesh->triangles[i+0].v0;
      const int a1 = tmesh->triangles[i+0].v1;
      const int a2 = tmesh->triangles[i+0].v2;
      if (i+1 == tmesh->triangles.size()) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      const int b0 = tmesh->triangles[i+1].v0;
      const int b1 = tmesh->triangles[i+1].v1;
      const int b2 = tmesh->triangles[i+1].v2;
      const std::pair<int,int> q = quad_index3(a0,a1,a2,b0,b1,b2);
      const int a3 = q.second;
      if (a3 == -1) {
        qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a2,a2));
        continue;
      }
      
      if      (q.first == -1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0));
      else if (q.first ==  0) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a3,a1,a2,a0));
      else if (q.first ==  1) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a0,a1,a3,a2));
      else if (q.first ==  2) qmesh->quads.push_back(SceneGraph::QuadMeshNode::Quad(a1,a2,a3,a0)); 
      i++;
    }
    return qmesh.dynamicCast<SceneGraph::Node>();
  }